

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_ec_ctrl_str_256(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  size_t sVar2;
  byte *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  char *unaff_retaddr;
  EVP_PKEY_CTX *in_stack_00000008;
  R3410_ec_params *p;
  int param_nid;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  R3410_ec_params *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp((char *)in_RSI,"paramset");
  if (iVar1 == 0) {
    if (in_RDX == (byte *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen((char *)in_RDX);
      if (sVar2 == 1) {
        iVar1 = toupper((uint)*in_RDX);
        switch(iVar1) {
        case 0x30:
          iVar1 = 0x347;
          break;
        default:
          return 0;
        case 0x41:
          iVar1 = 0x348;
          break;
        case 0x42:
          iVar1 = 0x349;
          break;
        case 0x43:
          iVar1 = 0x34a;
        }
      }
      else {
        sVar2 = strlen((char *)in_RDX);
        if ((sVar2 == 2) && (iVar1 = toupper((uint)*in_RDX), iVar1 == 0x58)) {
          iVar1 = toupper((uint)in_RDX[1]);
          if (iVar1 == 0x41) {
            iVar1 = 0x34b;
          }
          else {
            if (iVar1 != 0x42) {
              return 0;
            }
            iVar1 = 0x34c;
          }
        }
        else {
          sVar2 = strlen((char *)in_RDX);
          if ((sVar2 == 3) &&
             ((iVar1 = toupper((uint)*in_RDX), iVar1 == 0x54 &&
              (iVar1 = toupper((uint)in_RDX[1]), iVar1 == 0x43)))) {
            iVar1 = toupper((uint)in_RDX[2]);
            switch(iVar1) {
            case 0x41:
              iVar1 = 0x47c;
              break;
            case 0x42:
              iVar1 = 0x4a0;
              break;
            case 0x43:
              iVar1 = 0x4a1;
              break;
            case 0x44:
              iVar1 = 0x4a2;
              break;
            default:
              return 0;
            }
          }
          else {
            local_30 = R3410_2001_paramset;
            iVar1 = OBJ_txt2nid((char *)in_RDX);
            if (iVar1 == 0) {
              return 0;
            }
            for (; (local_30->nid != 0 && (local_30->nid != iVar1)); local_30 = local_30 + 1) {
            }
            if (local_30->nid == 0) {
              ERR_GOST_error(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8,0);
              return 0;
            }
          }
        }
      }
      iVar1 = pkey_gost_ctrl(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                             (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
  }
  else {
    iVar1 = pkey_gost_ec_ctrl_str_common
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar1;
}

Assistant:

static int pkey_gost_ec_ctrl_str_256(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
    if (strcmp(type, param_ctrl_string) == 0) {
        int param_nid = 0;

        if (!value) {
            return 0;
        }
        if (strlen(value) == 1) {
            switch (toupper((unsigned char)value[0])) {
            case 'A':
                param_nid = NID_id_GostR3410_2001_CryptoPro_A_ParamSet;
                break;
            case 'B':
                param_nid = NID_id_GostR3410_2001_CryptoPro_B_ParamSet;
                break;
            case 'C':
                param_nid = NID_id_GostR3410_2001_CryptoPro_C_ParamSet;
                break;
            case '0':
                param_nid = NID_id_GostR3410_2001_TestParamSet;
                break;
            default:
                return 0;
            }
        } else if ((strlen(value) == 2)
                   && (toupper((unsigned char)value[0]) == 'X')) {
            switch (toupper((unsigned char)value[1])) {
            case 'A':
                param_nid = NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet;
                break;
            case 'B':
                param_nid = NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet;
                break;
            default:
                return 0;
            }
    } else if ((strlen(value) == 3)
        && (toupper((unsigned char)value[0]) == 'T')
        && (toupper((unsigned char)value[1]) == 'C')) {
            switch (toupper((unsigned char)value[2])) {
            case 'A':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetA;
                break;
            case 'B':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetB;
                break;
            case 'C':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetC;
                break;
            case 'D':
                param_nid = NID_id_tc26_gost_3410_2012_256_paramSetD;
                break;
            default:
                return 0;
            }
        } else {
            R3410_ec_params *p = R3410_2001_paramset;
            param_nid = OBJ_txt2nid(value);
            if (param_nid == NID_undef) {
                return 0;
            }
            for (; p->nid != NID_undef; p++) {
                if (p->nid == param_nid)
                    break;
            }
            if (p->nid == NID_undef) {
                GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_256,
                        GOST_R_INVALID_PARAMSET);
                return 0;
            }
        }

        return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET,
                              param_nid, NULL);
    }

    return pkey_gost_ec_ctrl_str_common(ctx, type, value);
}